

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O2

vector<CardType,_std::allocator<CardType>_> * __thiscall
Deck::populateDeck(vector<CardType,_std::allocator<CardType>_> *__return_storage_ptr__,Deck *this)

{
  int i;
  int iVar1;
  CardType local_3c [3];
  
  (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (iVar1 = 0; iVar1 < *this->deckSize / 3; iVar1 = iVar1 + 1) {
    local_3c[2] = 0;
    std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
              (__return_storage_ptr__,local_3c + 2);
    local_3c[1] = 1;
    std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
              (__return_storage_ptr__,local_3c + 1);
    local_3c[0] = CAVALRY;
    std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
              (__return_storage_ptr__,local_3c);
  }
  setNumberOfCards(this,(int)((ulong)((long)(__return_storage_ptr__->
                                            super__Vector_base<CardType,_std::allocator<CardType>_>)
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(__return_storage_ptr__->
                                           super__Vector_base<CardType,_std::allocator<CardType>_>).
                                           _M_impl.super__Vector_impl_data._M_start) >> 2));
  return __return_storage_ptr__;
}

Assistant:

std::vector<CardType> Deck::populateDeck() {
    std::vector<CardType> deck = {};

    for (int i = 0; i < *Deck::getNumberOfCards() / 3; i++) {
        deck.emplace_back(CardType::INFANTRY);
        deck.emplace_back(CardType::ARTILLERY);
        deck.emplace_back(CardType::CAVALRY);
    }

    Deck::setNumberOfCards(deck.size());

    return deck;
}